

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall psy::C::Lexer::~Lexer(Lexer *this)

{
  Lexer *this_local;
  
  std::__cxx11::string::~string((string *)&this->text_);
  return;
}

Assistant:

Lexer::~Lexer()
{}